

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::connection::cgi_forwarder::read_response(cgi_forwarder *this)

{
  element_type *peVar1;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_80;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_78;
  intrusive_ptr<booster::callable<void_()>_> local_70;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_68 [8]
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2> local_58 [8]
  ;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  mutable_buffer local_48;
  
  peVar1 = (this->conn_).
           super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
            (local_58,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            ((offset_in_cgi_forwarder_to_subr)&local_70,
             (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)cleanup);
  booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&local_48,&local_70);
  (*peVar1->_vptr_connection[0x13])(peVar1,&local_48);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_()>_> *)&local_48);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  booster::aio::buffer(&local_48,&this->response_);
  std::__shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder,void>
            (local_68,(__weak_ptr<cppcms::impl::cgi::connection::cgi_forwarder,_(__gnu_cxx::_Lock_policy)2>
                       *)this);
  mfunc_to_io_handler<cppcms::impl::cgi::connection::cgi_forwarder,std::shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder>>
            ((offset_in_cgi_forwarder_to_subr)&local_80,
             (shared_ptr<cppcms::impl::cgi::connection::cgi_forwarder> *)on_response_read);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  intrusive_ptr(&local_78,&local_80);
  booster::aio::stream_socket::async_read_some((mutable_buffer *)&this->scgi_,(callback *)&local_48)
  ;
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_78);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::
  _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
  ::~_Vector_base(&local_48.super_buffer_impl<char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                 );
  return;
}

Assistant:

void read_response() 
		{
			conn_->async_read_eof(mfunc_to_handler(&cgi_forwarder::cleanup,shared_from_this()));
			scgi_.async_read_some(booster::aio::buffer(response_),
						mfunc_to_io_handler(&cgi_forwarder::on_response_read,shared_from_this()));
		}